

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valinvokegen.cpp
# Opt level: O2

Am_Object am_commandinvokegen_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_Value_List *pAVar5;
  Am_Constraint *pAVar6;
  Am_Object_Data *in_RDI;
  Am_Object AStack_78;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  Am_Object::Create((Am_Object *)&local_68,(char *)&Am_Window);
  pAVar2 = Am_Object::Set((Am_Object *)&local_68,0x89,
                          Am_Default_Pop_Up_Window_Destroy_Method.from_wrapper,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"Generalize Command for Match",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x1d8,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,0x96,0);
  pAVar2 = Am_Object::Add(pAVar2,0xc5,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xb8,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SCRIPT_WINDOW,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x169,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_INVOKE_MATCH_COMMAND,0,0);
  Am_Object::operator=(&am_commandinvokegen,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_68);
  Am_Object::Create((Am_Object *)&local_68,(char *)&Am_Text);
  pAVar2 = Am_Object::Set((Am_Object *)&local_68,100,9,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,9,0);
  pAVar2 = Am_Object::Set(pAVar2,0xab,"Generalize the command for match",0);
  Am_Font::Am_Font((Am_Font *)&AStack_78,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&AStack_78);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar2 = Am_Object::Set(pAVar2,0x6b,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  Am_Object::Add_Part(&am_commandinvokegen,&local_30,true,0);
  Am_Object::~Am_Object(&local_30);
  Am_Font::~Am_Font((Am_Font *)&AStack_78);
  Am_Object::~Am_Object((Am_Object *)&local_68);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create(&AStack_78,(char *)&Am_Radio_Button_Panel);
  pAVar2 = Am_Object::Set(&AStack_78,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x28,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  Am_Value_List::Am_Value_List(&local_68);
  Am_Object::Create(&local_70,(char *)&Am_Command);
  pAVar4 = Am_Object::Set(&local_70,0x150,"The specific command: ",0);
  pAVar4 = Am_Object::Set(pAVar4,0x153,1,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar5 = Am_Value_List::Add(&local_68,pAVar3,Am_TAIL,true);
  Am_Object::Create(&local_58,(char *)&Am_Command);
  pAVar4 = Am_Object::Set(&local_58,0x150,"Any command",0);
  pAVar4 = Am_Object::Set(pAVar4,0x153,0x20,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar3,Am_TAIL,true);
  Am_Object::Create(&local_40,(char *)&Am_Command);
  pAVar4 = Am_Object::Set(&local_40,0x150,"Custom...",0);
  pAVar4 = Am_Object::Set(pAVar4,0xcc,false,0);
  pAVar4 = Am_Object::Set(pAVar4,0x153,6,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar3,Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Vertical_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0,0);
  Am_Object::Am_Object(&local_38,pAVar2);
  Am_Object::Add_Part(&am_commandinvokegen,AVar1,&local_38,0);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_68);
  Am_Object::~Am_Object(&AStack_78);
  AVar1 = Am_CONSTANT_OBJECTS_WIDGET;
  Am_Object::Create(&local_70,(char *)&Am_Text_Input_Widget);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&am_active_if_constant_sel);
  pAVar2 = Am_Object::Set(&local_70,0xcc,pAVar6,0);
  pAVar2 = Am_Object::Set(pAVar2,100,0xb9,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x2a,0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0xc1,0);
  pAVar2 = Am_Object::Add(pAVar2,0xfa,&Am_No_Value,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Object::Get_Object(&AStack_78,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&AStack_78,0x150,"",0);
  Am_Object::Get_Owner((Am_Object *)&local_68,(Am_Slot_Flags)pAVar2);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar2 = Am_Object::Set((Am_Object *)&local_68,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_48,pAVar2);
  Am_Object::Add_Part(&am_commandinvokegen,AVar1,&local_48,0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object((Am_Object *)&local_68);
  Am_Object::~Am_Object(&AStack_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Create(&AStack_78,(char *)&Am_Button_Panel);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar2 = Am_Object::Set(&AStack_78,100,pAVar6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x73,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0x14,0);
  pAVar2 = Am_Object::Set(pAVar2,0x96,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_68);
  Am_Object::Create(&local_70,(char *)&Am_Standard_OK_Command);
  pAVar4 = Am_Object::Set(&local_70,0xca,am_commandinvokegen_ok.from_wrapper,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar5 = Am_Value_List::Add(&local_68,pAVar3,Am_TAIL,true);
  Am_Object::Create(&local_58,(char *)&Am_Standard_Cancel_Command);
  pAVar4 = Am_Object::Set(&local_58,0xca,am_commandinvokegen_cancel.from_wrapper,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar3,Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  Am_Object::Am_Object(&local_50,pAVar2);
  Am_Object::Add_Part(&am_commandinvokegen,&local_50,true,0);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_68);
  Am_Object::~Am_Object(&AStack_78);
  Am_Object::Create(&local_28,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(&am_commandinvokegen,&local_28,true,0);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_commandinvokegen);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_commandinvokegen_Initialize()
{
  am_commandinvokegen = Am_Window.Create(DSTR("am_commandinvokegen"))
                            .Set(Am_DESTROY_WINDOW_METHOD,
                                 Am_Default_Pop_Up_Window_Destroy_Method)
                            .Set(Am_FILL_STYLE, Am_Default_Color)
                            .Set(Am_TITLE, "Generalize Command for Match")
                            .Set(Am_WIDTH, 472)
                            .Set(Am_HEIGHT, 150)

                            .Add(Am_COMMAND, (0L))
                            .Add(Am_SLOTS_TO_SAVE, (0L))
                            .Add(Am_SCRIPT_WINDOW, (0L))
                            .Add(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, (0L))
                            .Add(Am_VALUE, (0L)) //the real value
                            .Add(Am_INVOKE_MATCH_COMMAND, (0L));
  am_commandinvokegen.Add_Part(
      Am_Text.Create()
          .Set(Am_LEFT, 9)
          .Set(Am_TOP, 9)
          .Set(Am_TEXT, "Generalize the command for match")
          .Set(Am_FONT,
               Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_LARGE))
          .Set(Am_LINE_STYLE, Am_Black)
          .Set(Am_FILL_STYLE, Am_No_Style));
  am_commandinvokegen.Add_Part(
      Am_UNDO_OPTIONS,
      Am_Radio_Button_Panel.Create(DSTR("radio control"))
          .Set(Am_LEFT, 15)
          .Set(Am_TOP, 40)
          .Set(Am_FILL_STYLE, Am_Default_Color)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "The specific command: ")
                                      .Set(Am_ID, am_constant_generalize))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Any command")
                                      .Set(Am_ID, am_any_value_generalize))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Custom...")
                                      .Set(Am_ACTIVE, false)
                                      .Set(Am_ID, am_custom_generalize)))
          .Set(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_H_SPACING, 0));
  am_commandinvokegen.Add_Part(
      Am_CONSTANT_OBJECTS_WIDGET,
      Am_Text_Input_Widget.Create(DSTR("CONSTANT_OBJECTS_WIDGET"))
          .Set(Am_ACTIVE, am_active_if_constant_sel)
          .Set(Am_LEFT, 185)
          .Set(Am_TOP, 42)
          .Set(Am_WIDTH, 193)
          .Add(Am_VALUES, Am_No_Value) //set with old value
          .Set(Am_ACTIVE_2, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "")
          .Get_Owner()
          .Set(Am_FILL_STYLE, Am_Default_Color));
  am_commandinvokegen.Add_Part(
      Am_Button_Panel.Create(DSTR("OK-cancel"))
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_TOP, 115)
          .Set(Am_FILL_STYLE, Am_Default_Color)
          .Set(Am_LAYOUT, Am_Horizontal_Layout)
          .Set(Am_H_SPACING, 20)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Standard_OK_Command.Create().Set(
                                 Am_DO_METHOD, am_commandinvokegen_ok))
                             .Add(Am_Standard_Cancel_Command.Create().Set(
                                 Am_DO_METHOD, am_commandinvokegen_cancel))));
  am_commandinvokegen.Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());
  return am_commandinvokegen;
}